

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetwindow.cpp
# Opt level: O1

void __thiscall QWidgetWindow::scheduleRepaint(QWidgetWindow *this)

{
  long lVar1;
  long lVar2;
  QWidget *pQVar3;
  long in_FS_OFFSET;
  int iVar4;
  int iVar6;
  undefined1 auVar5 [16];
  QRect local_20;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = QWindow::screen();
  if (((lVar2 != 0) && ((*(byte *)(*(long *)((this->m_widget).wp.value + 0x20) + 9) & 0x80) != 0))
     && ((*(byte *)(*(long *)((this->m_widget).wp.value + 0x20) + 9) & 4) == 0)) {
    lVar2 = *(long *)((this->m_widget).wp.value + 0x20);
    iVar4 = (int)*(undefined8 *)(lVar2 + 0x1c) - (int)*(undefined8 *)(lVar2 + 0x14);
    iVar6 = (int)((ulong)*(undefined8 *)(lVar2 + 0x1c) >> 0x20) -
            (int)((ulong)*(undefined8 *)(lVar2 + 0x14) >> 0x20);
    auVar5._0_4_ = -(uint)(-1 < iVar4);
    auVar5._4_4_ = -(uint)(-1 < iVar4);
    auVar5._8_4_ = -(uint)(-1 < iVar6);
    auVar5._12_4_ = -(uint)(-1 < iVar6);
    iVar4 = movmskpd((int)lVar2,auVar5);
    if (iVar4 == 3) {
      pQVar3 = QWidget::window((QWidget *)(this->m_widget).wp.value);
      lVar2 = *(long *)(*(long *)&pQVar3->field_0x8 + 0x78);
      if (lVar2 == 0) {
        lVar2 = 0;
      }
      else {
        lVar2 = *(long *)(lVar2 + 8);
      }
      if ((lVar2 != 0) && (*(long *)(lVar2 + 0x10) != 0)) {
        lVar1 = *(long *)((this->m_widget).wp.value + 0x20);
        local_20.x2.m_i = *(int *)(lVar1 + 0x1c) - *(int *)(lVar1 + 0x14);
        local_20.y2.m_i = *(int *)(lVar1 + 0x20) - *(int *)(lVar1 + 0x18);
        pQVar3 = (QWidget *)0x0;
        local_20.x1.m_i = 0;
        local_20.y1.m_i = 0;
        if (*(int *)((this->m_widget).wp.d + 4) != 0) {
          pQVar3 = (QWidget *)(this->m_widget).wp.value;
        }
        QWidgetRepaintManager::markDirty<QRect>
                  (*(QWidgetRepaintManager **)(lVar2 + 8),&local_20,pQVar3,UpdateLater,BufferInvalid
                  );
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetWindow::scheduleRepaint()
{
    if (!screen())
        return;

    if (!m_widget->isVisible() || !m_widget->updatesEnabled() || !m_widget->rect().isValid())
        return;

    QTLWExtra *tlwExtra = m_widget->window()->d_func()->maybeTopData();
    if (tlwExtra && tlwExtra->backingStore) {
        tlwExtra->repaintManager->markDirty(m_widget->rect(), m_widget,
            QWidgetRepaintManager::UpdateLater, QWidgetRepaintManager::BufferInvalid);
    }
}